

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O0

void __thiscall
iutest::detail::ParamTestSuiteHolder::~ParamTestSuiteHolder(ParamTestSuiteHolder *this)

{
  bool bVar1;
  reference ppIVar2;
  __normal_iterator<iutest::detail::IParamTestSuiteInfo_**,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
  local_30;
  __normal_iterator<iutest::detail::IParamTestSuiteInfo_*const_*,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
  local_28;
  const_iterator end;
  __normal_iterator<iutest::detail::IParamTestSuiteInfo_*const_*,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
  local_18;
  const_iterator it;
  ParamTestSuiteHolder *this_local;
  
  it._M_current = (IParamTestSuiteInfo **)this;
  end._M_current =
       (IParamTestSuiteInfo **)
       std::
       vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
       ::begin(&this->m_testsuite_infos);
  __gnu_cxx::
  __normal_iterator<iutest::detail::IParamTestSuiteInfo*const*,std::vector<iutest::detail::IParamTestSuiteInfo*,std::allocator<iutest::detail::IParamTestSuiteInfo*>>>
  ::__normal_iterator<iutest::detail::IParamTestSuiteInfo**>
            ((__normal_iterator<iutest::detail::IParamTestSuiteInfo*const*,std::vector<iutest::detail::IParamTestSuiteInfo*,std::allocator<iutest::detail::IParamTestSuiteInfo*>>>
              *)&local_18,
             (__normal_iterator<iutest::detail::IParamTestSuiteInfo_**,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
              *)&end);
  local_30._M_current =
       (IParamTestSuiteInfo **)
       std::
       vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
       ::end(&this->m_testsuite_infos);
  __gnu_cxx::
  __normal_iterator<iutest::detail::IParamTestSuiteInfo*const*,std::vector<iutest::detail::IParamTestSuiteInfo*,std::allocator<iutest::detail::IParamTestSuiteInfo*>>>
  ::__normal_iterator<iutest::detail::IParamTestSuiteInfo**>
            ((__normal_iterator<iutest::detail::IParamTestSuiteInfo*const*,std::vector<iutest::detail::IParamTestSuiteInfo*,std::allocator<iutest::detail::IParamTestSuiteInfo*>>>
              *)&local_28,&local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<iutest::detail::IParamTestSuiteInfo_*const_*,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
              ::operator*(&local_18);
    if (*ppIVar2 != (IParamTestSuiteInfo *)0x0) {
      (**(code **)(*(long *)*ppIVar2 + 8))();
    }
    __gnu_cxx::
    __normal_iterator<iutest::detail::IParamTestSuiteInfo_*const_*,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
  ::~vector(&this->m_testsuite_infos);
  return;
}

Assistant:

~ParamTestSuiteHolder()
    {
        // 解放
        for( TestSuiteInfoContainer::const_iterator it=m_testsuite_infos.begin(), end=m_testsuite_infos.end(); it != end; ++it )
        {
            delete *it;
        }
    }